

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::detail::ReferenceResolver::ReferenceResolver(ReferenceResolver *this,Tree *t_)

{
  pfn_allocate p_Var1;
  pfn_free p_Var2;
  pfn_error p_Var3;
  long lVar4;
  
  this->t = t_;
  memset(&this->refs,0,0x300);
  lVar4 = 8;
  do {
    *(undefined8 *)((long)(this->refs).m_buf + lVar4 + -8) = 0;
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0x308);
  (this->refs).m_stack = (this->refs).m_buf;
  (this->refs).m_size = 0;
  (this->refs).m_capacity = 0x10;
  p_Var1 = (t_->m_callbacks).m_allocate;
  p_Var2 = (t_->m_callbacks).m_free;
  p_Var3 = (t_->m_callbacks).m_error;
  (this->refs).m_callbacks.m_user_data = (t_->m_callbacks).m_user_data;
  (this->refs).m_callbacks.m_allocate = p_Var1;
  (this->refs).m_callbacks.m_free = p_Var2;
  (this->refs).m_callbacks.m_error = p_Var3;
  resolve(this);
  return;
}

Assistant:

ReferenceResolver(Tree *t_) : t(t_), refs(t_->callbacks())
    {
        resolve();
    }